

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_tap_printer.hpp
# Opt level: O0

void __thiscall
iutest::TAPFileGeneratorListener::TAPFileGeneratorListener
          (TAPFileGeneratorListener *this,char *directory)

{
  char *directory_local;
  TAPFileGeneratorListener *this_local;
  
  TAPPrintListener::TAPPrintListener(&this->super_TAPPrintListener);
  (this->super_TAPPrintListener).super_EmptyTestEventListener.super_TestEventListener.
  _vptr_TestEventListener = (_func_int **)&PTR__TAPFileGeneratorListener_00168f88;
  std::__cxx11::string::string((string *)&this->m_output_path);
  SetFilePath(this,directory);
  return;
}

Assistant:

explicit TAPFileGeneratorListener(const char* directory=NULL)
    {
        SetFilePath(directory);
    }